

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
::find_soo<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
           *this,key_arg<std::pair<const_void_*,_std::basic_string_view<char>_>_> *key)

{
  bool bVar1;
  slot_type *slot;
  pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>
  *ts;
  iterator iVar2;
  EqualElement<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_38;
  key_arg<std::pair<const_void_*,_std::basic_string_view<char>_>_> *local_28;
  key_arg<std::pair<const_void_*,_std::basic_string_view<char>_>_> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<std::pair<const_void_*,_std::basic_string_view<char>_>_> *)this;
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Hash = absl::hash_internal::Hash<std::pair<const void *, std::basic_string_view<char>>>, Eq = std::equal_to<std::pair<const void *, std::basic_string_view<char>>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>, K = std::pair<const void *, std::basic_string_view<char>>]"
                 );
  }
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                   *)this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  ::eq_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>::EqualElement<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)this);
      return iVar2;
    }
  }
  iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                 *)this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }